

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::DataTypeApplyOpFromText
               (char *buf,char *initial_value_buf,ImGuiDataType data_type,void *p_data,char *format)

{
  undefined1 uVar1;
  undefined2 uVar2;
  int iVar3;
  float fVar4;
  ulong uVar5;
  byte bVar6;
  double dVar7;
  int arg0i;
  float arg1f;
  int arg1i;
  ImGuiDataTypeTempStorage data_backup;
  double local_70;
  double *local_68;
  undefined8 local_60;
  float local_54;
  char *local_50;
  ulong local_48;
  size_t local_40;
  undefined1 local_38 [8];
  
  while( true ) {
    bVar6 = *buf;
    uVar5 = (ulong)bVar6;
    if (0x2f < uVar5) break;
    if ((0x100000200U >> (uVar5 & 0x3f) & 1) == 0) {
      if ((0x8c0000000000U >> (uVar5 & 0x3f) & 1) != 0) goto LAB_00173757;
      break;
    }
    buf = (char *)((byte *)buf + 1);
  }
  bVar6 = 0;
LAB_0017376d:
  if (*buf == 0) {
    return false;
  }
  local_50 = initial_value_buf;
  if (9 < (uint)data_type) {
    __assert_fail("data_type >= 0 && data_type < ImGuiDataType_COUNT",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_widgets.cpp"
                  ,0x777,"const ImGuiDataTypeInfo *ImGui::DataTypeGetInfo(ImGuiDataType)");
  }
  uVar5 = (ulong)(uint)data_type;
  local_40 = GDataTypeInfo[uVar5].Size;
  local_68 = (double *)p_data;
  local_48 = uVar5;
  memcpy(local_38,p_data,local_40);
  if (format == (char *)0x0) {
    format = GDataTypeInfo[uVar5].ScanFmt;
  }
  local_54 = 0.0;
  if (data_type == 9) {
    local_70 = *local_68;
    local_60 = 0.0;
    if ((bVar6 != 0) && (iVar3 = __isoc99_sscanf(local_50,"%lf",&local_70), iVar3 < 1)) {
      return false;
    }
    iVar3 = __isoc99_sscanf(buf,"%lf",&local_60);
    if (iVar3 < 1) {
      return false;
    }
    if (bVar6 == 0x2a) {
      dVar7 = local_70 * local_60;
    }
    else if (bVar6 == 0x2f) {
      if ((local_60 == 0.0) && (!NAN(local_60))) goto LAB_00173ba1;
      dVar7 = local_70 / local_60;
    }
    else {
      dVar7 = local_60;
      if (bVar6 == 0x2b) {
        dVar7 = local_70 + local_60;
      }
    }
    *local_68 = dVar7;
    goto LAB_00173ba1;
  }
  if (data_type == 8) {
    local_70 = (double)CONCAT44(local_70._4_4_,*(float *)local_68);
    local_60 = (double)((ulong)local_60._4_4_ << 0x20);
    if ((bVar6 != 0) && (iVar3 = __isoc99_sscanf(local_50,"%f",&local_70), iVar3 < 1)) {
      return false;
    }
    iVar3 = __isoc99_sscanf(buf,"%f",&local_60);
    if (iVar3 < 1) {
      return false;
    }
    if (bVar6 == 0x2a) {
      fVar4 = local_70._0_4_ * (float)local_60;
    }
    else if (bVar6 == 0x2f) {
      if (((float)local_60 == 0.0) && (!NAN((float)local_60))) goto LAB_00173ba1;
      fVar4 = local_70._0_4_ / (float)local_60;
    }
    else {
      fVar4 = (float)local_60;
      if (bVar6 == 0x2b) {
        fVar4 = local_70._0_4_ + (float)local_60;
      }
    }
    *(float *)local_68 = fVar4;
    goto LAB_00173ba1;
  }
  if (data_type == 4) {
    local_70 = (double)CONCAT44(local_70._4_4_,*(float *)local_68);
    local_60 = (double)((ulong)local_60._4_4_ << 0x20);
    if (bVar6 == 0) {
LAB_00173a12:
      iVar3 = __isoc99_sscanf(buf,format,&local_54);
      fVar4 = local_54;
      if (iVar3 != 1) goto LAB_00173ba1;
    }
    else {
      iVar3 = __isoc99_sscanf(local_50,format,&local_70);
      if (iVar3 < 1) {
        return false;
      }
      if (bVar6 == 0x2a) {
        iVar3 = __isoc99_sscanf(buf,"%f",&local_60);
        if (iVar3 == 0) goto LAB_00173ba1;
        fVar4 = (float)(int)((float)(int)local_70._0_4_ * (float)local_60);
      }
      else if (bVar6 == 0x2f) {
        iVar3 = __isoc99_sscanf(buf,"%f",&local_60);
        if (iVar3 == 0) goto LAB_00173ba1;
        if (((float)local_60 == 0.0) && (!NAN((float)local_60))) goto LAB_00173ba1;
        fVar4 = (float)(int)((float)(int)local_70._0_4_ / (float)local_60);
      }
      else {
        if (bVar6 != 0x2b) goto LAB_00173a12;
        iVar3 = __isoc99_sscanf(buf,"%d",&local_54);
        if (iVar3 == 0) goto LAB_00173ba1;
        fVar4 = (float)((int)local_54 + (int)local_70._0_4_);
      }
    }
    *(float *)local_68 = fVar4;
    goto LAB_00173ba1;
  }
  if (data_type - 5U < 3) {
    iVar3 = __isoc99_sscanf(buf,format);
    if (iVar3 < 1) {
      return false;
    }
    goto LAB_00173ba1;
  }
  iVar3 = __isoc99_sscanf(buf,format,&local_70);
  if (iVar3 < 1) {
    return false;
  }
  if (3 < (uint)data_type) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_widgets.cpp"
                  ,0x825,
                  "bool ImGui::DataTypeApplyOpFromText(const char *, const char *, ImGuiDataType, void *, const char *)"
                 );
  }
  switch((long)&switchD_001739ea::switchdataD_001bead0 +
         (long)(int)(&switchD_001739ea::switchdataD_001bead0)[local_48]) {
  case 0x1739ec:
    iVar3 = 0x7f;
    if ((int)local_70._0_4_ < 0x7f) {
      iVar3 = (int)local_70._0_4_;
    }
    uVar1 = 0x80;
    if (-0x80 < iVar3) {
      uVar1 = (undefined1)iVar3;
    }
    break;
  case 0x173b48:
    iVar3 = 0x7fff;
    if ((int)local_70._0_4_ < 0x7fff) {
      iVar3 = (int)local_70._0_4_;
    }
    uVar2 = 0x8000;
    if (-0x8000 < iVar3) {
      uVar2 = (undefined2)iVar3;
    }
    goto LAB_00173b7b;
  case 0x173b66:
    iVar3 = 0xffff;
    if ((int)local_70._0_4_ < 0xffff) {
      iVar3 = (int)local_70._0_4_;
    }
    uVar2 = 0;
    if (0 < iVar3) {
      uVar2 = (undefined2)iVar3;
    }
LAB_00173b7b:
    *(undefined2 *)local_68 = uVar2;
    goto LAB_00173ba1;
  case 0x173b85:
    iVar3 = 0xff;
    if ((int)local_70._0_4_ < 0xff) {
      iVar3 = (int)local_70._0_4_;
    }
    uVar1 = 0;
    if (0 < iVar3) {
      uVar1 = (undefined1)iVar3;
    }
  }
  *(undefined1 *)local_68 = uVar1;
LAB_00173ba1:
  iVar3 = bcmp(local_38,local_68,local_40);
  return iVar3 != 0;
LAB_00173757:
  do {
    do {
      buf = (char *)((byte *)buf + 1);
    } while (*buf == 0x20);
  } while (*buf == 9);
  goto LAB_0017376d;
}

Assistant:

bool ImGui::DataTypeApplyOpFromText(const char* buf, const char* initial_value_buf, ImGuiDataType data_type, void* p_data, const char* format)
{
    while (ImCharIsBlankA(*buf))
        buf++;

    // We don't support '-' op because it would conflict with inputing negative value.
    // Instead you can use +-100 to subtract from an existing value
    char op = buf[0];
    if (op == '+' || op == '*' || op == '/')
    {
        buf++;
        while (ImCharIsBlankA(*buf))
            buf++;
    }
    else
    {
        op = 0;
    }
    if (!buf[0])
        return false;

    // Copy the value in an opaque buffer so we can compare at the end of the function if it changed at all.
    const ImGuiDataTypeInfo* type_info = DataTypeGetInfo(data_type);
    ImGuiDataTypeTempStorage data_backup;
    memcpy(&data_backup, p_data, type_info->Size);

    if (format == NULL)
        format = type_info->ScanFmt;

    // FIXME-LEGACY: The aim is to remove those operators and write a proper expression evaluator at some point..
    int arg1i = 0;
    if (data_type == ImGuiDataType_S32)
    {
        int* v = (int*)p_data;
        int arg0i = *v;
        float arg1f = 0.0f;
        if (op && sscanf(initial_value_buf, format, &arg0i) < 1)
            return false;
        // Store operand in a float so we can use fractional value for multipliers (*1.1), but constant always parsed as integer so we can fit big integers (e.g. 2000000003) past float precision
        if (op == '+')      { if (sscanf(buf, "%d", &arg1i)) *v = (int)(arg0i + arg1i); }                   // Add (use "+-" to subtract)
        else if (op == '*') { if (sscanf(buf, "%f", &arg1f)) *v = (int)(arg0i * arg1f); }                   // Multiply
        else if (op == '/') { if (sscanf(buf, "%f", &arg1f) && arg1f != 0.0f) *v = (int)(arg0i / arg1f); }  // Divide
        else                { if (sscanf(buf, format, &arg1i) == 1) *v = arg1i; }                           // Assign constant
    }
    else if (data_type == ImGuiDataType_Float)
    {
        // For floats we have to ignore format with precision (e.g. "%.2f") because sscanf doesn't take them in
        format = "%f";
        float* v = (float*)p_data;
        float arg0f = *v, arg1f = 0.0f;
        if (op && sscanf(initial_value_buf, format, &arg0f) < 1)
            return false;
        if (sscanf(buf, format, &arg1f) < 1)
            return false;
        if (op == '+')      { *v = arg0f + arg1f; }                    // Add (use "+-" to subtract)
        else if (op == '*') { *v = arg0f * arg1f; }                    // Multiply
        else if (op == '/') { if (arg1f != 0.0f) *v = arg0f / arg1f; } // Divide
        else                { *v = arg1f; }                            // Assign constant
    }
    else if (data_type == ImGuiDataType_Double)
    {
        format = "%lf"; // scanf differentiate float/double unlike printf which forces everything to double because of ellipsis
        double* v = (double*)p_data;
        double arg0f = *v, arg1f = 0.0;
        if (op && sscanf(initial_value_buf, format, &arg0f) < 1)
            return false;
        if (sscanf(buf, format, &arg1f) < 1)
            return false;
        if (op == '+')      { *v = arg0f + arg1f; }                    // Add (use "+-" to subtract)
        else if (op == '*') { *v = arg0f * arg1f; }                    // Multiply
        else if (op == '/') { if (arg1f != 0.0f) *v = arg0f / arg1f; } // Divide
        else                { *v = arg1f; }                            // Assign constant
    }
    else if (data_type == ImGuiDataType_U32 || data_type == ImGuiDataType_S64 || data_type == ImGuiDataType_U64)
    {
        // All other types assign constant
        // We don't bother handling support for legacy operators since they are a little too crappy. Instead we will later implement a proper expression evaluator in the future.
        if (sscanf(buf, format, p_data) < 1)
            return false;
    }
    else
    {
        // Small types need a 32-bit buffer to receive the result from scanf()
        int v32;
        if (sscanf(buf, format, &v32) < 1)
            return false;
        if (data_type == ImGuiDataType_S8)
            *(ImS8*)p_data = (ImS8)ImClamp(v32, (int)IM_S8_MIN, (int)IM_S8_MAX);
        else if (data_type == ImGuiDataType_U8)
            *(ImU8*)p_data = (ImU8)ImClamp(v32, (int)IM_U8_MIN, (int)IM_U8_MAX);
        else if (data_type == ImGuiDataType_S16)
            *(ImS16*)p_data = (ImS16)ImClamp(v32, (int)IM_S16_MIN, (int)IM_S16_MAX);
        else if (data_type == ImGuiDataType_U16)
            *(ImU16*)p_data = (ImU16)ImClamp(v32, (int)IM_U16_MIN, (int)IM_U16_MAX);
        else
            IM_ASSERT(0);
    }

    return memcmp(&data_backup, p_data, type_info->Size) != 0;
}